

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O0

int JPC_ISTERMINATED(int passno,int firstpassno,int numpasses,int termall,int lazy)

{
  int iVar1;
  uint local_20;
  int n;
  int ret;
  int lazy_local;
  int termall_local;
  int numpasses_local;
  int firstpassno_local;
  int passno_local;
  
  if (passno - firstpassno == numpasses + -1) {
    local_20 = 1;
  }
  else {
    iVar1 = JPC_SEGPASSCNT(passno,firstpassno,numpasses,lazy,termall);
    local_20 = (uint)(iVar1 < 2);
  }
  return local_20;
}

Assistant:

int JPC_ISTERMINATED(int passno, int firstpassno, int numpasses, int termall,
  int lazy)
{
	int ret;
	int n;
	if (passno - firstpassno == numpasses - 1) {
		ret = 1;
	} else {
		n = JPC_SEGPASSCNT(passno, firstpassno, numpasses, lazy, termall);
		ret = (n <= 1) ? 1 : 0;
	}

	return ret;
}